

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

uint * __thiscall
cimg_library::CImg<unsigned_int>::max_min<float>(CImg<unsigned_int> *this,float *min_val)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  CImgInstanceException *this_00;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  char *pcVar8;
  
  puVar3 = this->_data;
  if ((((puVar3 != (uint *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    uVar4 = *puVar3;
    lVar6 = (ulong)this->_spectrum * (ulong)this->_depth *
            (ulong)this->_height * (ulong)this->_width;
    uVar5 = uVar4;
    if (0 < lVar6) {
      puVar1 = puVar3 + lVar6;
      puVar7 = puVar3;
      do {
        uVar2 = *puVar7;
        if (uVar4 < uVar2) {
          puVar3 = puVar7;
          uVar4 = uVar2;
        }
        if (uVar2 < uVar5) {
          uVar5 = uVar2;
        }
        puVar7 = puVar7 + 1;
      } while (puVar7 < puVar1);
    }
    *min_val = (float)uVar5;
    return puVar3;
  }
  this_00 = (CImgInstanceException *)__cxa_allocate_exception(0x10);
  pcVar8 = "non-";
  if (this->_is_shared != false) {
    pcVar8 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_00,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::max_min(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar8,"unsigned int");
  __cxa_throw(this_00,&CImgInstanceException::typeinfo,CImgException::~CImgException);
}

Assistant:

const T& max_min(t& min_val) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "max_min(): Empty instance.",
                                    cimg_instance);
      const T *ptr_max = _data;
      T max_value = *ptr_max, min_value = max_value;
      cimg_for(*this,ptrs,T) {
        const T val = *ptrs;
        if (val>max_value) { max_value = val; ptr_max = ptrs; }
        if (val<min_value) min_value = val;
      }
      min_val = (t)min_value;
      return *ptr_max;
    }